

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

PrefixedLogger * __thiscall
phosg::PrefixedLogger::subf
          (PrefixedLogger *__return_storage_ptr__,PrefixedLogger *this,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string prefix;
  va_list va;
  string local_108;
  char local_e8 [8];
  size_type *local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &prefix._M_string_length;
  local_e8[0] = '\x18';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '\0';
  local_e8[4] = '0';
  local_e8[5] = '\0';
  local_e8[6] = '\0';
  local_e8[7] = '\0';
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  string_vprintf_abi_cxx11_(&local_108,(phosg *)fmt,local_e8,(__va_list_tag *)0x3000000018);
  sub(__return_storage_ptr__,this,&local_108,USE_DEFAULT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

PrefixedLogger PrefixedLogger::subf(const char* fmt, ...) const {
  va_list va;
  va_start(va, fmt);
  string prefix = string_vprintf(fmt, va);
  va_end(va);
  return this->sub(prefix);
}